

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O2

ScalarFunction * duckdb::MapContainsFun::GetFunction(void)

{
  LogicalType varargs;
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee4;
  FunctionNullHandling in_stack_fffffffffffffef0;
  allocator_type local_10a;
  allocator local_109;
  code *bind_lambda;
  LogicalType local_e8;
  LogicalType local_d0;
  LogicalType local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  LogicalType local_88 [3];
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"map_contains",&local_109);
  LogicalType::LogicalType(&local_b8,ANY);
  LogicalType::LogicalType(&local_d0,ANY);
  LogicalType::MAP(local_88,&local_b8,&local_d0);
  LogicalType::LogicalType(local_88 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,&local_10a);
  LogicalType::LogicalType(&local_e8,BOOLEAN);
  bind_lambda = MapContainsFunction;
  LogicalType::LogicalType(local_88 + 2,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_88 + 2;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffedc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffee4;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_40,(vector<duckdb::LogicalType,_true> *)&local_a0,&local_e8,
             (scalar_function_t *)&stack0xfffffffffffffef8,MapContainsBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffef0,bind_lambda);
  LogicalType::~LogicalType(local_88 + 2);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffef8);
  LogicalType::~LogicalType(&local_e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_88[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_d0);
  LogicalType::~LogicalType(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

ScalarFunction MapContainsFun::GetFunction() {
	ScalarFunction fun("map_contains", {LogicalType::MAP(LogicalType::ANY, LogicalType::ANY), LogicalType::ANY},
	                   LogicalType::BOOLEAN, MapContainsFunction, MapContainsBind);
	return fun;
}